

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DFAContentModel.cpp
# Opt level: O2

bool __thiscall
xercesc_4_0::DFAContentModel::validateContent
          (DFAContentModel *this,QName **children,XMLSize_t childCount,uint param_3,
          XMLSize_t *indexFailingChild,MemoryManager *param_5)

{
  QName *this_00;
  QName *this_01;
  Occurence *pOVar1;
  bool bVar2;
  uint uVar3;
  NodeTypes NVar4;
  int iVar5;
  XMLCh *pXVar6;
  XMLCh *str1;
  uint uVar7;
  ulong uVar8;
  XMLCh *str2;
  uint uVar9;
  ulong uVar10;
  uint nextState;
  uint local_5c;
  XMLSize_t *local_58;
  uint local_50;
  uint nextLoop;
  uint local_48;
  uint local_44;
  QName **local_40;
  ulong local_38;
  
  if (childCount == 0) {
    if (this->fEmptyOk != false) {
      return true;
    }
    *indexFailingChild = 0;
  }
  else {
    nextState = 0;
    local_48 = 0xffffffff;
    local_5c = 0xffffffff;
    uVar9 = 0;
    uVar7 = 0;
    uVar3 = 0;
    local_58 = indexFailingChild;
    local_40 = children;
    local_38 = childCount;
    while( true ) {
      uVar10 = (ulong)uVar9;
      if (local_38 <= uVar10) break;
      this_00 = local_40[uVar10];
      local_50 = uVar3;
      if (this->fDTD == true) {
        pXVar6 = QName::getRawName(this_00);
      }
      else {
        pXVar6 = (XMLCh *)0x0;
      }
      if ((this->fIsMixed != true) || (this_00->fURIId != local_48)) {
        local_44 = uVar7;
        for (uVar8 = 0; uVar8 < this->fElemMapSize; uVar8 = uVar8 + 1) {
          this_01 = this->fElemMap[uVar8];
          if (this->fDTD == true) {
            str1 = QName::getRawName(this_01);
            str2 = pXVar6;
LAB_002e3a65:
            bVar2 = XMLString::equals(str1,str2);
            if (bVar2) {
LAB_002e3abb:
              nextState = this->fTransTable[uVar3][uVar8];
              if (nextState != local_5c) break;
            }
          }
          else if (this->fElemMapType[uVar8] == Leaf) {
            if (this_01->fURIId == this_00->fURIId) {
              str1 = this_01->fLocalPart;
              str2 = this_00->fLocalPart;
              goto LAB_002e3a65;
            }
          }
          else {
            NVar4 = this->fElemMapType[uVar8] & (Any_NS|Any_Other);
            if (NVar4 == Any_NS) {
              if (this_01->fURIId == this_00->fURIId) goto LAB_002e3abb;
            }
            else if (NVar4 == Any_Other) {
              if ((this_00->fURIId != 1) && (this_00->fURIId != this_01->fURIId)) goto LAB_002e3abb;
            }
            else if (NVar4 == Any) goto LAB_002e3abb;
          }
        }
        if ((nextState == local_5c) || (this->fElemMapSize == (uint)uVar8)) goto LAB_002e3b5c;
        nextLoop = 0;
        iVar5 = (*(this->super_XMLContentModel)._vptr_XMLContentModel[7])
                          (this,this_00,(ulong)local_50,(ulong)local_44,&nextState,&nextLoop,uVar8,0
                          );
        local_50 = nextState;
        if ((char)iVar5 == '\0') goto LAB_002e3b5c;
        nextState = 0;
        uVar7 = nextLoop;
      }
      uVar3 = local_50;
      uVar9 = uVar9 + 1;
    }
    if (this->fFinalStateFlags[uVar3] != false) {
      if (this->fCountingStates == (Occurence **)0x0) {
        return true;
      }
      pOVar1 = this->fCountingStates[uVar3];
      if (pOVar1 == (Occurence *)0x0) {
        return true;
      }
      if ((uint)pOVar1->minOccurs <= uVar7) {
        return true;
      }
    }
LAB_002e3b5c:
    *local_58 = uVar10;
  }
  return false;
}

Assistant:

bool
DFAContentModel::validateContent( QName** const        children
                                , XMLSize_t            childCount
                                , unsigned int
                                , XMLSize_t*           indexFailingChild
                                , MemoryManager*    const) const
{
    //
    //  If there are no children, then either we fail on the 0th element
    //  or we return success. It depends upon whether this content model
    //  accepts empty content, which we determined earlier.
    //
    if (!childCount)
    {
        // success
        if(fEmptyOk)
            return true;
        *indexFailingChild=0;
        return false;
    }

    //
    //  Lets loop through the children in the array and move our way
    //  through the states. Note that we use the fElemMap array to map
    //  an element index to a state index.
    //
    unsigned int curState = 0;
    unsigned int nextState = 0;
    unsigned int loopCount = 0;
    unsigned int childIndex = 0;
    for (; childIndex < childCount; childIndex++)
    {
        // Get the current element index out
        const QName* curElem = children[childIndex];
        const XMLCh* curElemRawName = 0;
        if (fDTD)
            curElemRawName = curElem->getRawName();

        // If this is text in a Schema mixed content model, skip it.
        if ( fIsMixed &&
            ( curElem->getURI() == XMLElementDecl::fgPCDataElemId))
            continue;

        // Look up this child in our element map
        unsigned int elemIndex = 0;
        for (; elemIndex < fElemMapSize; elemIndex++)
        {
            const QName* inElem  = fElemMap[elemIndex];
            if (fDTD) {
                if (XMLString::equals(inElem->getRawName(), curElemRawName)) {
                    nextState = fTransTable[curState][elemIndex];
                    if (nextState != XMLContentModel::gInvalidTrans)
                        break;
                }
            }
            else {
                ContentSpecNode::NodeTypes type = fElemMapType[elemIndex];
                if (type == ContentSpecNode::Leaf)
                {
                    if ((inElem->getURI() == curElem->getURI()) &&
                    (XMLString::equals(inElem->getLocalPart(), curElem->getLocalPart()))) {
                        nextState = fTransTable[curState][elemIndex];
                        if (nextState != XMLContentModel::gInvalidTrans)
                            break;
                    }
                }
                else if ((type & 0x0f)== ContentSpecNode::Any)
                {
                    nextState = fTransTable[curState][elemIndex];
                    if (nextState != XMLContentModel::gInvalidTrans)
                        break;
                }
                else if ((type & 0x0f) == ContentSpecNode::Any_NS)
                {
                    if (inElem->getURI() == curElem->getURI())
                    {
                        nextState = fTransTable[curState][elemIndex];
                        if (nextState != XMLContentModel::gInvalidTrans)
                            break;
                    }
                }
                else if ((type & 0x0f) == ContentSpecNode::Any_Other)
                {
                    // Here we assume that empty string has id 1.
                    //
                    unsigned int uriId = curElem->getURI();
                    if (uriId != 1 && uriId != inElem->getURI()) {
                        nextState = fTransTable[curState][elemIndex];
                        if (nextState != XMLContentModel::gInvalidTrans)
                            break;
                    }
                }
            }
        }//for elemIndex

        // If "nextState" is -1, we found a match, but the transition is invalid
        if (nextState == XMLContentModel::gInvalidTrans)
        {
            *indexFailingChild=childIndex;
            return false;
        }

        // If we didn't find it, then obviously not valid
        if (elemIndex == fElemMapSize)
        {
            *indexFailingChild=childIndex;
            return false;
        }

        unsigned int nextLoop = 0;
        if(!handleRepetitions(curElem, curState, loopCount, nextState, nextLoop, elemIndex, 0))
        {
            *indexFailingChild=childIndex;
            return false;
        }

        curState = nextState;
        loopCount = nextLoop;
        nextState = 0;

    }//for childIndex

    //
    //  We transitioned all the way through the input list. However, that
    //  does not mean that we ended in a final state. So check whether
    //  our ending state is a final state.
    //
    if (!fFinalStateFlags[curState])
    {
        *indexFailingChild=childIndex;
        return false;
    }

    // verify if we exited before the minOccurs was satisfied
    if (fCountingStates != 0) {
        Occurence* o = fCountingStates[curState];
        if (o != 0 && loopCount < (unsigned int)o->minOccurs) {
            // not enough loops on the current state to be considered final.
            *indexFailingChild=childIndex;
            return false;
        }
    }

    //success
    return true;
}